

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error_code.hpp
# Opt level: O2

string_ref * __thiscall
system_error2::_std_error_code_domain::_do_message
          (string_ref *__return_storage_ptr__,_std_error_code_domain *this,status_code<void> *code)

{
  ulong uVar1;
  _error_code_type c;
  
  uVar1 = code->_domain->_id;
  if (uVar1 == (this->super_status_code_domain)._id) {
    c._0_8_ = uVar1 ^ 0x223a160d20de97b4;
    c._M_cat = (error_category *)code->_domain;
    _make_string_ref(__return_storage_ptr__,
                     (_std_error_code_domain *)(ulong)*(uint *)&code[1]._domain,c);
    return __return_storage_ptr__;
  }
  __assert_fail("code.domain() == *this",
                "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/std_error_code.hpp"
                ,0x126,
                "virtual _std_error_code_domain::string_ref system_error2::_std_error_code_domain::_do_message(const status_code<void> &) const"
               );
}

Assistant:

inline _std_error_code_domain::string_ref _std_error_code_domain::_do_message(const status_code<void> &code) const noexcept
{
  assert(code.domain() == *this);
  const auto &c = static_cast<const std_error_code &>(code);  // NOLINT
  return _make_string_ref(_error_code_type(c.value(), c.category()));
}